

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerDivI4(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpCode branchOpCode;
  BailOutKind BVar3;
  BailOutKind BVar4;
  int32 iVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  JITTimeFunctionBody *pJVar9;
  Instr *instr_00;
  LabelInstr *target;
  LabelInstr *target_00;
  Opnd *pOVar10;
  IntConstOpnd *pIVar11;
  Instr *insertBeforeInstr_00;
  LabelInstr *target_01;
  LabelInstr *instr_01;
  LabelInstr *negDenominatorCheckLabel;
  LabelInstr *skipNegDenominatorCheckLabel;
  Opnd *resultOpnd;
  Instr *insertBeforeInstr;
  int pow2;
  bool isFastDiv;
  Opnd *nominatorOpnd;
  Opnd *denominatorOpnd;
  LabelInstr *bailOutLabel;
  LabelInstr *doneLabel;
  Instr *nonBailOutInstr;
  BailOutKind bailOutKind;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6aad,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((instr->m_opcode != Div_I4) && (instr->m_opcode != DivU_I4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6aae,
                       "(instr->m_opcode == Js::OpCode::Div_I4 || instr->m_opcode == Js::OpCode::DivU_I4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Div_I4 || instr->m_opcode == Js::OpCode::DivU_I4"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar8 = IR::Instr::GetSrc2(instr);
  if (pOVar8 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6abc,"(instr->GetSrc2())","instr->GetSrc2()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pJVar9 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(pJVar9);
  if (bVar2) {
    bVar2 = LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr,(LabelInstr *)0x0);
    if (!bVar2) {
      LowererMD::EmitInt4Instr(instr);
    }
  }
  else {
    pJVar9 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar9);
    if (bVar2) {
      bVar2 = LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr,(LabelInstr *)0x0);
      if (!bVar2) {
        LowerDivI4Common(this,instr);
      }
    }
    else {
      bVar2 = IR::Instr::HasBailOutInfo(instr);
      if (bVar2) {
        BVar3 = IR::Instr::GetBailOutKind(instr);
        BVar4 = IR::operator|(BailOnDivResultNotInt,BailOutOnNegativeZero);
        BVar4 = IR::operator|(BVar4,BailOutOnDivByZero);
        BVar4 = IR::operator|(BVar4,BailOutOnDivOfMinInt);
        BVar4 = IR::operator~(BVar4);
        BVar3 = IR::operator&(BVar3,BVar4);
        bVar2 = IR::operator!(BVar3);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x6ad8,
                             "(!(instr->GetBailOutKind() & ~(IR::BailOnDivResultNotInt | IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)))"
                             ,
                             "!(instr->GetBailOutKind() & ~(IR::BailOnDivResultNotInt | IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt))"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        BVar3 = IR::Instr::GetBailOutKind(instr);
        instr_00 = IR::Instr::New(instr->m_opcode,instr->m_func);
        IR::Instr::TransferTo(instr,instr_00);
        IR::Instr::InsertBefore(instr,instr_00);
        target = IR::LabelInstr::New(Label,instr->m_func,false);
        IR::Instr::InsertAfter(instr,&target->super_Instr);
        target_00 = GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,
                                    (LabelInstr *)0x0);
        pOVar8 = IR::Instr::GetSrc2(instr_00);
        pOVar10 = IR::Instr::GetSrc1(instr_00);
        insertBeforeInstr._7_1_ = false;
        BVar4 = IR::operator&(BVar3,BailOutOnDivOfMinInt);
        if (BVar4 != BailOutInvalid) {
          pIVar11 = IR::IntConstOpnd::New(-0x80000000,TyInt32,this->m_func,true);
          InsertCompareBranch(this,pOVar10,&pIVar11->super_Opnd,BrEq_A,target_00,instr_00,false);
        }
        bVar2 = IR::Opnd::IsIntConstOpnd(pOVar8);
        if (bVar2) {
          pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar8);
          iVar5 = IR::IntConstOpnd::AsInt32(pIVar11);
          bVar2 = Math::IsPow2(iVar5);
          if (bVar2) {
            BVar4 = IR::operator|(BailOutOnNegativeZero,BailOutOnDivByZero);
            BVar4 = IR::operator&(BVar3,BVar4);
            if (BVar4 != BailOutInvalid) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6af3,
                                 "((bailOutKind & (IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero)) == 0)"
                                 ,
                                 "(bailOutKind & (IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero)) == 0"
                                );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar8);
            iVar5 = IR::IntConstOpnd::AsInt32(pIVar11);
            bVar2 = Math::IsPow2(iVar5);
            if (bVar2) {
              pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar8);
              uVar6 = IR::IntConstOpnd::AsInt32(pIVar11);
              pIVar11 = IR::IntConstOpnd::New((long)(int)(uVar6 - 1),TyInt32,this->m_func,false);
              InsertTestBranch(pOVar10,&pIVar11->super_Opnd,BrNeq_A,target_00,instr_00);
              instr_00->m_opcode = Shr_A;
              uVar6 = Math::Log2(uVar6);
              pIVar11 = IR::IntConstOpnd::New((ulong)uVar6,TyInt32,this->m_func,false);
              IR::Instr::ReplaceSrc2(instr_00,&pIVar11->super_Opnd);
              LowererMD::ChangeToShift(instr_00,false);
              LowererMD::Legalize<false>(instr_00,false);
              insertBeforeInstr._7_1_ = true;
            }
            else {
              insertBeforeInstr._7_1_ =
                   LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr_00,target_00);
            }
          }
        }
        if (insertBeforeInstr._7_1_ == false) {
          BVar4 = IR::operator&(BVar3,BailOutOnDivByZero);
          if (BVar4 != BailOutInvalid) {
            InsertTestBranch(pOVar8,pOVar8,BrEq_A,target_00,instr_00);
          }
          insertBeforeInstr_00 =
               LowererMD::LowerDivI4AndBailOnReminder(&this->m_lowererMD,instr_00,target_00);
          pOVar10 = IR::Instr::GetDst(instr_00);
          BVar3 = IR::operator&(BVar3,BailOutOnNegativeZero);
          if (BVar3 != BailOutInvalid) {
            target_01 = IR::LabelInstr::New(Label,this->m_func,false);
            InsertTestBranch(pOVar10,pOVar10,BrNeq_A,target_01,insertBeforeInstr_00);
            instr_01 = IR::LabelInstr::New(Label,this->m_func,true);
            IR::Instr::InsertBefore(insertBeforeInstr_00,&instr_01->super_Instr);
            branchOpCode = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
            InsertTestBranch(pOVar8,pOVar8,branchOpCode,target_00,insertBeforeInstr_00);
            IR::Instr::InsertBefore(insertBeforeInstr_00,&target_01->super_Instr);
          }
        }
        InsertBranch(Br,target,&target_00->super_Instr);
      }
      else {
        bVar2 = LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr,(LabelInstr *)0x0);
        if (!bVar2) {
          LowererMD::EmitInt4Instr(instr);
        }
      }
    }
  }
  return;
}

Assistant:

void
Lowerer::LowerDivI4(IR::Instr * instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::Div_I4 || instr->m_opcode == Js::OpCode::DivU_I4);

#ifdef _M_IX86
    if (
        instr->GetDst() && instr->GetDst()->IsInt64() ||
        instr->GetSrc1() && instr->GetSrc1()->IsInt64() ||
        instr->GetSrc2() && instr->GetSrc2()->IsInt64()
        )
    {
        m_lowererMD.EmitInt64Instr(instr);
        return;
    }
#endif

    Assert(instr->GetSrc2());
    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        if (!m_lowererMD.GenerateFastDivAndRem(instr))
        {
            m_lowererMD.EmitInt4Instr(instr);
        }
        return;
    }

    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        if (!m_lowererMD.GenerateFastDivAndRem(instr))
        {
            LowerDivI4Common(instr);
        }
        return;
    }

    if(!instr->HasBailOutInfo())
    {
        if (!m_lowererMD.GenerateFastDivAndRem(instr))
        {
            m_lowererMD.EmitInt4Instr(instr);
        }
        return;
    }

    Assert(!(instr->GetBailOutKind() & ~(IR::BailOnDivResultNotInt | IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)));

    IR::BailOutKind bailOutKind = instr->GetBailOutKind();

    // Split out and generate the bailout instruction
    const auto nonBailOutInstr = IR::Instr::New(instr->m_opcode, instr->m_func);
    instr->TransferTo(nonBailOutInstr);
    instr->InsertBefore(nonBailOutInstr);

    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    instr->InsertAfter(doneLabel);

    // Generate the bailout helper call. 'instr' will be changed to the CALL into the bailout function, so it can't be used for
    // ordering instructions anymore.
    IR::LabelInstr * bailOutLabel = GenerateBailOut(instr);

    IR::Opnd * denominatorOpnd = nonBailOutInstr->GetSrc2();
    IR::Opnd * nominatorOpnd = nonBailOutInstr->GetSrc1();
    bool isFastDiv = false;
    if (bailOutKind & IR::BailOutOnDivOfMinInt)
    {
        // Bailout if numerator is MIN_INT  (could also check for denominator being -1
        // before bailing out, but does not seem worth the extra code..)
        InsertCompareBranch(nominatorOpnd, IR::IntConstOpnd::New(INT32_MIN, TyInt32, this->m_func, true), Js::OpCode::BrEq_A, bailOutLabel, nonBailOutInstr);
    }
    if (denominatorOpnd->IsIntConstOpnd() && Math::IsPow2(denominatorOpnd->AsIntConstOpnd()->AsInt32()))
    {
        Assert((bailOutKind & (IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero)) == 0);
        if (Math::IsPow2(denominatorOpnd->AsIntConstOpnd()->AsInt32()))
        {
            int pow2 = denominatorOpnd->AsIntConstOpnd()->AsInt32();
            InsertTestBranch(nominatorOpnd, IR::IntConstOpnd::New(pow2 - 1, TyInt32, this->m_func),
                Js::OpCode::BrNeq_A, bailOutLabel, nonBailOutInstr);
            nonBailOutInstr->m_opcode = Js::OpCode::Shr_A;
            nonBailOutInstr->ReplaceSrc2(IR::IntConstOpnd::New(Math::Log2(pow2), TyInt32, this->m_func));
            LowererMD::ChangeToShift(nonBailOutInstr, false);
            LowererMD::Legalize(nonBailOutInstr);
            isFastDiv = true;
        }
        else
        {
            isFastDiv = m_lowererMD.GenerateFastDivAndRem(nonBailOutInstr, bailOutLabel);
        }

    }
    if (!isFastDiv)
    {
        if (bailOutKind & IR::BailOutOnDivByZero)
        {
            // Bailout if denominator is 0
            InsertTestBranch(denominatorOpnd, denominatorOpnd, Js::OpCode::BrEq_A, bailOutLabel, nonBailOutInstr);
        }

        // Lower the div and bailout if there is a reminder (machine specific)
        IR::Instr * insertBeforeInstr = m_lowererMD.LowerDivI4AndBailOnReminder(nonBailOutInstr, bailOutLabel);

        IR::Opnd * resultOpnd = nonBailOutInstr->GetDst();
        if (bailOutKind & IR::BailOutOnNegativeZero)
        {
            //      TEST result, result
            //      JNE skipNegDenominatorCheckLabel         // Result not 0
            //      TEST denominator, denominator
            //      JNSB/BMI bailout                         // bail if negative
            // skipNegDenominatorCheckLabel:

            IR::LabelInstr * skipNegDenominatorCheckLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            // Skip negative denominator check if the result is not 0
            InsertTestBranch(resultOpnd, resultOpnd, Js::OpCode::BrNeq_A, skipNegDenominatorCheckLabel, insertBeforeInstr);

            IR::LabelInstr * negDenominatorCheckLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
            insertBeforeInstr->InsertBefore(negDenominatorCheckLabel);
            // Jump to done if the denominator is not negative
            InsertTestBranch(denominatorOpnd, denominatorOpnd,
                LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), bailOutLabel, insertBeforeInstr);
            insertBeforeInstr->InsertBefore(skipNegDenominatorCheckLabel);
        }
    }

    // We are all fine, jump around the bailout to done
    InsertBranch(Js::OpCode::Br, doneLabel, bailOutLabel);
}